

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  undefined2 uVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  sbyte sVar4;
  uchar uVar7;
  int iVar5;
  size_t sVar6;
  undefined8 extraout_RAX;
  uchar uVar10;
  size_t sVar8;
  LodePNGColorMode *pLVar9;
  unsigned_short *a_00;
  byte bVar11;
  uint bits;
  uint uVar12;
  uchar uVar13;
  undefined8 extraout_RDX;
  uchar uVar14;
  unsigned_short grey;
  uchar uVar16;
  ulong uVar15;
  long lVar17;
  unsigned_short *r_00;
  ulong uVar18;
  long lVar19;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ulong local_d0;
  LodePNGColorMode *local_c8;
  LodePNGColorMode *local_c0;
  ColorTree tree;
  
  iVar5 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar5 != 0) {
    sVar6 = lodepng_get_raw_size(w,h,mode_in);
    for (sVar8 = 0; sVar6 != sVar8; sVar8 = sVar8 + 1) {
      out[sVar8] = in[sVar8];
    }
    return 0;
  }
  local_d0 = (ulong)(h * w);
  local_c8 = mode_in;
  local_c0 = mode_out;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar18 = mode_out->palettesize;
    uVar15 = 1L << ((ulong)(byte)mode_out->bitdepth & 0x3f);
    pLVar9 = mode_out;
    if (uVar18 == 0) {
      uVar18 = mode_in->palettesize;
      pLVar9 = mode_in;
    }
    puVar2 = pLVar9->palette;
    if (uVar18 < uVar15) {
      uVar15 = uVar18;
    }
    color_tree_init(&tree);
    for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
      color_tree_add(&tree,puVar2[uVar18 * 4],puVar2[uVar18 * 4 + 1],puVar2[uVar18 * 4 + 2],
                     puVar2[uVar18 * 4 + 3],(uint)uVar18);
    }
  }
  pLVar9 = local_c0;
  if (local_c0->bitdepth == 0x10 && local_c8->bitdepth == 0x10) {
    lVar17 = 5;
    for (sVar6 = 0; pLVar9 = local_c0, local_d0 != sVar6; sVar6 = sVar6 + 1) {
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      getPixelColorRGBA16(&r,&g,&b,&a,in,sVar6,local_c8);
      uVar14 = (uchar)r;
      uVar16 = (uchar)(r >> 8);
      uVar10 = (uchar)(a >> 8);
      uVar13 = (uchar)(g >> 8);
      uVar7 = (uchar)(b >> 8);
      switch(pLVar9->colortype) {
      case LCT_GREY:
        uVar1 = swap_bytes(r);
        *(undefined2 *)(out + sVar6 * 2) = uVar1;
        break;
      case LCT_RGB:
        out[lVar17 + -5] = uVar16;
        out[lVar17 + -4] = uVar14;
        out[lVar17 + -3] = uVar13;
        out[lVar17 + -2] = (uchar)g;
        out[lVar17 + -1] = uVar7;
        out[lVar17] = (uchar)b;
        break;
      case LCT_GREY_ALPHA:
        out[sVar6 * 4] = uVar16;
        out[sVar6 * 4 + 1] = uVar14;
        out[sVar6 * 4 + 2] = uVar10;
        out[sVar6 * 4 + 3] = (uchar)a;
        break;
      case LCT_RGBA:
        out[sVar6 * 8] = uVar16;
        out[sVar6 * 8 + 1] = uVar14;
        out[sVar6 * 8 + 2] = uVar13;
        out[sVar6 * 8 + 3] = (uchar)g;
        out[sVar6 * 8 + 4] = uVar7;
        out[sVar6 * 8 + 5] = (uchar)b;
        out[sVar6 * 8 + 6] = uVar10;
        out[sVar6 * 8 + 7] = (uchar)a;
      }
      lVar17 = lVar17 + 6;
    }
    goto LAB_0036c06b;
  }
  if (local_c0->bitdepth == 8) {
    if (local_c0->colortype == LCT_RGB) {
      uVar12 = 0;
    }
    else {
      if (local_c0->colortype != LCT_RGBA) goto LAB_0036be91;
      uVar12 = 1;
    }
    getPixelColorsRGBA8(out,local_d0,uVar12,in,local_c8);
  }
  else {
LAB_0036be91:
    g = g & 0xff00;
    r = r & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    lVar17 = 2;
    lVar19 = 5;
    for (sVar6 = 0; local_d0 != sVar6; sVar6 = sVar6 + 1) {
      r_00 = &r;
      a_00 = &a;
      getPixelColorRGBA8((uchar *)r_00,(uchar *)&g,(uchar *)&b,(uchar *)a_00,in,sVar6,local_c8);
      if (pLVar9->colortype < 7) {
        uVar18 = CONCAT71((int7)((ulong)extraout_RAX >> 8),(byte)r);
        switch(pLVar9->colortype) {
        case LCT_GREY:
          bits = pLVar9->bitdepth;
          if (bits == 0x10) {
            out[sVar6 * 2 + 1] = (byte)r;
            out[sVar6 * 2] = (byte)r;
          }
          else {
            if (bits != 8) {
              bVar11 = (byte)bits;
              sVar4 = (bVar11 < 0x21) * (' ' - bVar11);
              uVar12 = ((uint)((byte)r >> ((byte)(8 - bVar11) & 0x1f)) << sVar4) >> sVar4;
              goto LAB_0036c022;
            }
LAB_0036bf73:
            out[sVar6] = (uchar)uVar18;
          }
          break;
        case LCT_RGB:
          if (pLVar9->bitdepth == 8) {
            out[lVar17 + -2] = (byte)r;
            out[lVar17 + -1] = (uchar)g;
            out[lVar17] = (uchar)b;
          }
          else {
            out[lVar19 + -4] = (byte)r;
            out[lVar19 + -5] = (byte)r;
            out[lVar19 + -2] = (uchar)g;
            out[lVar19 + -3] = (uchar)g;
            out[lVar19] = (uchar)b;
            out[lVar19 + -1] = (uchar)b;
          }
          break;
        case LCT_PALETTE:
          uVar12 = color_tree_get(&tree,(byte)r,(uchar)g,(uchar)b,(uchar)a);
          uVar18 = (ulong)uVar12;
          if ((int)uVar12 < 0) {
            return 0x52;
          }
          bits = pLVar9->bitdepth;
          if (bits == 8) goto LAB_0036bf73;
LAB_0036c022:
          addColorBits(out,sVar6,bits,uVar12);
          break;
        case LCT_GREY_ALPHA:
          if (pLVar9->bitdepth == 0x10) {
            out[sVar6 * 4 + 1] = (byte)r;
            out[sVar6 * 4] = (byte)r;
            out[sVar6 * 4 + 3] = (uchar)a;
            out[sVar6 * 4 + 2] = (uchar)a;
          }
          else if (pLVar9->bitdepth == 8) {
            out[sVar6 * 2] = (byte)r;
            out[sVar6 * 2 + 1] = (uchar)a;
          }
          break;
        case LCT_RGBA:
          if (pLVar9->bitdepth == 8) {
            out[sVar6 * 4] = (byte)r;
            out[sVar6 * 4 + 1] = (uchar)g;
            out[sVar6 * 4 + 2] = (uchar)b;
            out[sVar6 * 4 + 3] = (uchar)a;
          }
          else {
            auVar3 = vpinsrb_avx(ZEXT416((uint)uVar18),
                                 (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),(uchar)g),1);
            auVar3 = vpinsrb_avx(auVar3,(int)CONCAT71((int7)((ulong)a_00 >> 8),(uchar)b),2);
            auVar3 = vpinsrb_avx(auVar3,(int)CONCAT71((int7)((ulong)r_00 >> 8),(uchar)a),3);
            auVar3 = vpunpcklbw_avx(auVar3,auVar3);
            *(long *)(out + sVar6 * 8) = auVar3._0_8_;
          }
        }
      }
      lVar17 = lVar17 + 3;
      lVar19 = lVar19 + 6;
    }
  }
LAB_0036c06b:
  if (pLVar9->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}